

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

string_view __thiscall hgdb::json::Scope<hgdb::json::Module>::type(Scope<hgdb::json::Module> *this)

{
  char *pcVar1;
  bool bVar2;
  string_view sVar3;
  
  bVar2 = (this->super_ScopeBase).scopes_.
          super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->super_ScopeBase).scopes_.
          super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  pcVar1 = "block";
  if (bVar2) {
    pcVar1 = "none";
  }
  sVar3._M_len = (ulong)bVar2 ^ 5;
  sVar3._M_str = pcVar1;
  return sVar3;
}

Assistant:

[[nodiscard]] std::string_view type() const override {
        return scopes_.empty() ? "none" : "block";
    }